

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.cpp
# Opt level: O0

string * HTTP::URLEncode(string *__return_storage_ptr__,string *raw)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char local_29;
  ulong uStack_28;
  char c;
  size_t i;
  char buf [3];
  string *psStack_18;
  string *raw_local;
  string *encoded;
  
  i._7_1_ = 0;
  psStack_18 = raw;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (uStack_28 = 0; uVar1 = uStack_28, uVar2 = std::__cxx11::string::length(), uVar1 < uVar2;
      uStack_28 = uStack_28 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)raw);
    local_29 = *pcVar3;
    if ((((local_29 < 'a') || ('z' < local_29)) && ((local_29 < 'A' || ('Z' < local_29)))) &&
       ((local_29 < '0' || ('9' < local_29)))) {
      snprintf((char *)((long)&i + 4),3,"%02x",(ulong)(uint)(int)local_29);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"%",&local_81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,(char *)((long)&i + 4),2,&local_a9);
      std::operator+(&local_60,&local_80,&local_a8);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_29);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HTTP::URLEncode(std::string raw)
{
	std::string encoded;
	char buf[3];

	for (size_t i = 0; i < raw.length(); ++i)
	{
		char c = raw[i];

		if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9'))
		{
			encoded += c;
		}
		else
		{
			using namespace std;
			snprintf(buf, 3, "%02x", c);
			encoded += std::string("%") + std::string(buf, 2);
		}
	}

	return encoded;
}